

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BigInt.h
# Opt level: O1

BigInt * __thiscall BigInt::operator/(BigInt *__return_storage_ptr__,BigInt *this,BigInt *v)

{
  BigInt local_a0;
  BigInt local_80;
  pair<BigInt,_BigInt> local_60;
  
  std::vector<long_long,_std::allocator<long_long>_>::vector
            (&local_80.vector_value,&this->vector_value);
  local_80.sign = this->sign;
  std::vector<long_long,_std::allocator<long_long>_>::vector
            (&local_a0.vector_value,&v->vector_value);
  local_a0.sign = v->sign;
  divModBig(&local_60,&local_80,&local_a0);
  std::vector<long_long,_std::allocator<long_long>_>::vector
            (&__return_storage_ptr__->vector_value,
             (vector<long_long,_std::allocator<long_long>_> *)&local_60);
  __return_storage_ptr__->sign = local_60.first.sign;
  if (local_60.second.vector_value.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl
      .super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_60.second.vector_value.
                    super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_60.first.vector_value.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_60.first.vector_value.
                    super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_a0.vector_value.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a0.vector_value.super__Vector_base<long_long,_std::allocator<long_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_80.vector_value.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_80.vector_value.super__Vector_base<long_long,_std::allocator<long_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

BigInt operator/(const BigInt &v) const {
        return divModBig(*this, v).first;
    }